

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_command.cpp
# Opt level: O2

void __thiscall duckdb::LoopCommand::ExecuteInternal(LoopCommand *this,ExecuteContext *context)

{
  bool *pbVar1;
  pointer puVar2;
  int iVar3;
  runtime_error *prVar4;
  pointer pCVar5;
  pointer pLVar6;
  _List_node_base *p_Var7;
  unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true> *statement;
  pointer puVar8;
  _List_node_base *p_Var9;
  ReusableStringStream local_138;
  string local_120;
  StringRef local_100;
  list<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_> contexts;
  LoopDefinition loop_def;
  list<std::thread,_std::allocator<std::thread>_> threads;
  AssertionHandler catchAssertionHandler;
  
  LoopDefinition::LoopDefinition(&loop_def,&this->definition);
  loop_def.loop_idx = (this->definition).loop_start;
  if (loop_def.is_parallel == false) {
    do {
      if (((((this->super_Command).runner)->finished_processing_file)._M_base._M_i & 1U) != 0)
      break;
      std::vector<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_>::push_back
                (&(context->running_loops).
                  super_vector<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_>,
                 &loop_def);
      puVar2 = (this->loop_commands).
               super_vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar8 = (this->loop_commands).
                    super_vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1
          ) {
        pCVar5 = unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>::operator->
                           (puVar8);
        Command::Execute(pCVar5,context);
      }
      std::vector<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_>::pop_back
                (&(context->running_loops).
                  super_vector<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_>);
      loop_def.loop_idx = loop_def.loop_idx + 1;
    } while (loop_def.loop_idx < loop_def.loop_end);
  }
  else {
    pLVar6 = (context->running_loops).
             super_vector<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_>.
             super__Vector_base<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_>.
             _M_impl.super__Vector_impl_data._M_start;
    while (pLVar6 != (context->running_loops).
                     super_vector<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_>.
                     super__Vector_base<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_>
                     ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar1 = &pLVar6->is_parallel;
      pLVar6 = pLVar6 + 1;
      if (*pbVar1 == true) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Nested parallel loop commands not allowed");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    puVar8 = (this->loop_commands).
             super_vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->loop_commands).
             super_vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while (puVar8 != puVar2) {
      pCVar5 = unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>::operator->
                         (puVar8);
      iVar3 = (*pCVar5->_vptr_Command[3])(pCVar5);
      puVar8 = puVar8 + 1;
      if ((char)iVar3 == '\0') {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar4,"Concurrent loop is not supported over this command");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    contexts.
    super__List_base<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_>
    ._M_impl._M_node._M_size = 0;
    contexts.
    super__List_base<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&contexts;
    contexts.
    super__List_base<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&contexts;
    do {
      std::__cxx11::
      list<duckdb::ParallelExecuteContext,std::allocator<duckdb::ParallelExecuteContext>>::
      emplace_back<duckdb::SQLLogicTestRunner&,duckdb::vector<duckdb::unique_ptr<duckdb::Command,std::default_delete<duckdb::Command>,true>,true>const&,duckdb::LoopDefinition&>
                ((list<duckdb::ParallelExecuteContext,std::allocator<duckdb::ParallelExecuteContext>>
                  *)&contexts,(this->super_Command).runner,&this->loop_commands,&loop_def);
      loop_def.loop_idx = loop_def.loop_idx + 1;
    } while (loop_def.loop_idx < loop_def.loop_end);
    threads.super__List_base<std::thread,_std::allocator<std::thread>_>._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)&threads;
    threads.super__List_base<std::thread,_std::allocator<std::thread>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)&threads;
    threads.super__List_base<std::thread,_std::allocator<std::thread>_>._M_impl._M_node._M_size = 0;
    p_Var7 = (_List_node_base *)&contexts;
    while (p_Var7 = p_Var7->_M_next, p_Var9 = (_List_node_base *)&threads,
          p_Var7 != (_List_node_base *)&contexts) {
      catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)(p_Var7 + 1);
      std::__cxx11::list<std::thread,std::allocator<std::thread>>::
      emplace_back<void(&)(duckdb::ParallelExecuteContext*),duckdb::ParallelExecuteContext*>
                ((list<std::thread,std::allocator<std::thread>> *)&threads,ParallelExecuteLoop,
                 (ParallelExecuteContext **)&catchAssertionHandler);
    }
    while (p_Var9 = p_Var9->_M_next, p_Var9 != (_List_node_base *)&threads) {
      std::thread::join();
    }
    p_Var7 = (_List_node_base *)&contexts;
    while (p_Var7 = (((_List_base<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_>
                       *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var7 != (_List_node_base *)&contexts) {
      if (((ulong)p_Var7[6]._M_prev & 1) == 0) {
        if (p_Var7[7]._M_prev == (_List_node_base *)0x0) {
          local_120._M_dataplus._M_p = "FAIL";
          local_120._M_string_length = 4;
          local_138.super_NonCopyable._vptr_NonCopyable = (_func_int **)p_Var7[9]._M_next;
          local_138.m_index = (size_t)*(int *)&p_Var7[0xb]._M_next;
          Catch::AssertionHandler::AssertionHandler
                    (&catchAssertionHandler,(StringRef *)&local_120,(SourceLineInfo *)&local_138,
                     (StringRef)ZEXT816(0x47e8a1),Normal);
          local_138.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
          local_138.m_index = 0;
          local_138.m_oss = (ostream *)0x0;
          Catch::ReusableStringStream::ReusableStringStream(&local_138);
          std::ostream::operator<<(local_138.m_oss,0);
          Catch::ReusableStringStream::str_abi_cxx11_(&local_120,&local_138);
          local_100.m_start = local_120._M_dataplus._M_p;
          local_100.m_size = local_120._M_string_length;
          Catch::AssertionHandler::handleMessage(&catchAssertionHandler,ExplicitFailure,&local_100);
          std::__cxx11::string::~string((string *)&local_120);
          Catch::ReusableStringStream::~ReusableStringStream(&local_138);
          Catch::AssertionHandler::complete(&catchAssertionHandler);
        }
        else {
          local_120._M_dataplus._M_p = "FAIL";
          local_120._M_string_length = 4;
          local_138.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x470615;
          local_138.m_index = 0x13e;
          Catch::AssertionHandler::AssertionHandler
                    (&catchAssertionHandler,(StringRef *)&local_120,(SourceLineInfo *)&local_138,
                     (StringRef)ZEXT816(0x47e8a1),Normal);
          local_138.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
          local_138.m_index = 0;
          local_138.m_oss = (ostream *)0x0;
          Catch::ReusableStringStream::ReusableStringStream(&local_138);
          std::operator<<((ostream *)local_138.m_oss,(string *)(p_Var7 + 7));
          Catch::ReusableStringStream::str_abi_cxx11_(&local_120,&local_138);
          local_100.m_start = local_120._M_dataplus._M_p;
          local_100.m_size = local_120._M_string_length;
          Catch::AssertionHandler::handleMessage(&catchAssertionHandler,ExplicitFailure,&local_100);
          std::__cxx11::string::~string((string *)&local_120);
          Catch::ReusableStringStream::~ReusableStringStream(&local_138);
          Catch::AssertionHandler::complete(&catchAssertionHandler);
        }
        Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      }
    }
    std::__cxx11::_List_base<std::thread,_std::allocator<std::thread>_>::_M_clear
              (&threads.super__List_base<std::thread,_std::allocator<std::thread>_>);
    std::__cxx11::
    _List_base<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_>::
    _M_clear(&contexts.
              super__List_base<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_>
            );
  }
  LoopDefinition::~LoopDefinition(&loop_def);
  return;
}

Assistant:

void LoopCommand::ExecuteInternal(ExecuteContext &context) const {
	LoopDefinition loop_def = definition;
	loop_def.loop_idx = definition.loop_start;
	if (loop_def.is_parallel) {
		for (auto &running_loop : context.running_loops) {
			if (running_loop.is_parallel) {
				throw std::runtime_error("Nested parallel loop commands not allowed");
			}
		}
		for (auto &command : loop_commands) {
			if (!command->SupportsConcurrent()) {
				throw std::runtime_error("Concurrent loop is not supported over this command");
			}
		}
		// parallel loop: launch threads
		std::list<ParallelExecuteContext> contexts;
		while (true) {
			contexts.emplace_back(runner, loop_commands, loop_def);
			loop_def.loop_idx++;
			if (loop_def.loop_idx >= loop_def.loop_end) {
				// finished
				break;
			}
		}
		std::list<std::thread> threads;
		for (auto &context : contexts) {
			threads.emplace_back(ParallelExecuteLoop, &context);
		}
		for (auto &thread : threads) {
			thread.join();
		}
		for (auto &context : contexts) {
			if (!context.success) {
				if (!context.error_message.empty()) {
					FAIL(context.error_message);
				} else {
					FAIL_LINE(context.error_file, context.error_line, 0);
				}
			}
		}
	} else {
		bool finished = false;
		while (!finished && !runner.finished_processing_file) {
			// execute the current iteration of the loop
			context.running_loops.push_back(loop_def);
			for (auto &statement : loop_commands) {
				statement->Execute(context);
			}
			context.running_loops.pop_back();
			loop_def.loop_idx++;
			if (loop_def.loop_idx >= loop_def.loop_end) {
				// finished
				break;
			}
		}
	}
}